

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O0

Matrix<double,_2,_2> * __thiscall
tcu::Matrix<double,_2,_2>::operator=(Matrix<double,_2,_2> *this,Matrix<double,_2,_2> *src)

{
  double dVar1;
  double *pdVar2;
  undefined4 local_20;
  undefined4 local_1c;
  int col;
  int row;
  Matrix<double,_2,_2> *src_local;
  Matrix<double,_2,_2> *this_local;
  
  for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
      pdVar2 = operator()(src,local_1c,local_20);
      dVar1 = *pdVar2;
      pdVar2 = operator()(this,local_1c,local_20);
      *pdVar2 = dVar1;
    }
  }
  return this;
}

Assistant:

Matrix<T, Rows, Cols>& Matrix<T, Rows, Cols>::operator= (const Matrix<T, Rows, Cols>& src)
{
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			(*this)(row, col) = src(row, col);
	return *this;
}